

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_pubsub_is_attached(fio_pubsub_engine_s *engine)

{
  uint uVar1;
  fio_engine_set__map_s_ *pfVar2;
  fio_pubsub_engine_s *obj;
  fio_lock_i ret;
  
  fio_lock(&fio_postoffice.engines.lock);
  pfVar2 = fio_engine_set__find_map_pos_((fio_engine_set_s *)engine,(uintptr_t)engine,obj);
  uVar1 = 0;
  if ((pfVar2 != (fio_engine_set__map_s_ *)0x0) &&
     (pfVar2->pos != (fio_engine_set__ordered_s_ *)0x0)) {
    uVar1 = (uint)(pfVar2->pos->obj != (fio_pubsub_engine_s *)0x0);
  }
  LOCK();
  fio_postoffice.engines.lock = '\0';
  UNLOCK();
  return uVar1;
}

Assistant:

int fio_pubsub_is_attached(fio_pubsub_engine_s *engine) {
  fio_pubsub_engine_s *addr;
  fio_lock(&fio_postoffice.engines.lock);
  addr = fio_engine_set_find(&fio_postoffice.engines.set, (uintptr_t)engine,
                             engine);
  fio_unlock(&fio_postoffice.engines.lock);
  return addr != NULL;
}